

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer_private.hh
# Opt level: O0

string * __thiscall qpdf::Tokenizer::getValue_abi_cxx11_(Tokenizer *this)

{
  string *local_20;
  Tokenizer *this_local;
  
  if ((this->type == tt_name) || (this->type == tt_string)) {
    local_20 = &this->val;
  }
  else {
    local_20 = &this->raw_val;
  }
  return local_20;
}

Assistant:

inline std::string const&
        getValue() const
        {
            return (this->type == QPDFTokenizer::tt_name || this->type == QPDFTokenizer::tt_string)
                ? this->val
                : this->raw_val;
        }